

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcomplex.c
# Opt level: O0

doublecomplex z_sgn(doublecomplex *z)

{
  doublecomplex dVar1;
  double dVar2;
  double t;
  doublecomplex *z_local;
  doublecomplex retval;
  
  dVar2 = z_abs(z);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    z_local = (doublecomplex *)(z->r / dVar2);
    retval.r = z->i / dVar2;
  }
  else {
    z_local = (doublecomplex *)0x3ff0000000000000;
    retval.r = 0.0;
  }
  dVar1.i = retval.r;
  dVar1.r = (double)z_local;
  return dVar1;
}

Assistant:

doublecomplex z_sgn(doublecomplex *z)
{
    register double t = z_abs(z);
    register doublecomplex retval;

    if (t == 0.0) {
	retval.r = 1.0, retval.i = 0.0;
    } else {
	retval.r = z->r / t, retval.i = z->i / t;
    }

    return retval;
}